

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionStrain
          (ChElementBeamTaperedTimoshenko *this,double eta,ChVector<double> *StrainV_trans,
          ChVector<double> *StrainV_rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ulong uVar4;
  ChVector<double> *this_00;
  Scalar *pSVar5;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar6;
  undefined1 auVar7 [16];
  ChVectorDynamic<> displ_ec;
  ChVectorDynamic<> displ;
  ChVectorN<double,_6> sect_ek;
  __tuple_element_t<4UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_2,_1,_1,_2>_>_>
  dkNx1;
  __tuple_element_t<1UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  dddkNbz;
  __tuple_element_t<0UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  dddkNby;
  __tuple_element_t<1UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  ddkNbz;
  __tuple_element_t<0UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>_>_>
  ddkNby;
  __tuple_element_t<3UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_2,_1,_1,_2>_>_>
  dkNsz;
  __tuple_element_t<1UL,_tuple<Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_4,_1,_1,_4>,_Matrix<double,_1,_2,_1,_1,_2>_>_>
  dkNsy;
  ChVectorN<double,_4> qez;
  ChVectorN<double,_4> qey;
  ChVectorN<double,_2> qerx;
  ChVectorN<double,_2> qeux;
  ShapeFunctionGroup NN;
  void *local_668 [2];
  undefined1 local_658 [56];
  double local_620;
  undefined8 uStack_618;
  ChVector<double> *local_608;
  Matrix<double,__1,_1,_0,__1,_1> local_600;
  Matrix<double,_6,_1,_0,_6,_1> local_5f0;
  double local_5c0;
  undefined8 uStack_5b8;
  double local_5b0;
  undefined8 uStack_5a8;
  Matrix<double,_4,_1,_0,_4,_1> *local_5a0;
  Index IStack_598;
  Index IStack_590;
  Index IStack_588;
  double local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  double local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  double local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  Matrix<double,_4,_1,_0,_4,_1> *local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  double local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_4e0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_4c0 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_4a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_490;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_480;
  Index IStack_470;
  Index IStack_468;
  double local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  double local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  double local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  double local_400;
  undefined8 uStack_3f8;
  Matrix<double,_4,_1,_0,_4,_1> *local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  double local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  
  local_620 = eta;
  if ((this->tapered_section).
      super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    local_480.m_lhs._0_4_ =
         (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
           _vptr_ChElementBase[3])();
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_600,(int *)&local_480);
    (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase[6])
              (this,&local_600);
    local_480 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&this->T,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_600);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_668,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_480);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,1);
    local_480.m_rhs = (RhsNested)0x0;
    local_480.m_lhs = (LhsNested)local_4c0;
    IStack_470 = 1;
    IStack_468 = 1;
    local_4c0[0]._vptr__Sp_counted_base = (_func_int **)*pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,5);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_480,pSVar5
                       );
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,7);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar6,pSVar5);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,0xb)
    ;
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar6,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_480);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,2);
    local_480.m_rhs = (RhsNested)0x0;
    local_480.m_lhs = (LhsNested)local_4e0;
    IStack_470 = 1;
    IStack_468 = 1;
    local_4e0[0]._vptr__Sp_counted_base = (_func_int **)*pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,4);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_480,pSVar5
                       );
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,8);
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar6,pSVar5);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,10);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar6,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)&local_480);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,0);
    local_480.m_rhs = (RhsNested)0x0;
    local_480.m_lhs = (LhsNested)&local_490;
    IStack_470 = 1;
    IStack_468 = 1;
    local_490._vptr__Sp_counted_base = (_func_int **)*pSVar5;
    local_608 = StrainV_trans;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,6);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_480,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_480);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,3);
    local_480.m_rhs = (RhsNested)0x0;
    local_480.m_lhs = (LhsNested)&local_4a0;
    IStack_470 = 1;
    IStack_468 = 1;
    local_4a0._vptr__Sp_counted_base = (_func_int **)*pSVar5;
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_668,9);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_480,pSVar5);
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)&local_480);
    ShapeFunctionsTimoshenko(this,(ShapeFunctionGroup *)&local_480,local_620);
    local_520 = local_3e0;
    uStack_518 = uStack_3d8;
    uStack_510 = uStack_3d0;
    uStack_508 = uStack_3c8;
    local_500 = local_3a0;
    uStack_4f8 = uStack_398;
    uStack_4f0 = uStack_390;
    uStack_4e8 = uStack_388;
    local_5b0 = local_400;
    uStack_5a8 = uStack_3f8;
    local_560 = local_440;
    uStack_558 = uStack_438;
    uStack_550 = uStack_430;
    uStack_548 = uStack_428;
    local_540 = local_420;
    uStack_538 = uStack_418;
    uStack_530 = uStack_410;
    uStack_528 = uStack_408;
    local_580 = local_460;
    uStack_578 = uStack_458;
    uStack_570 = uStack_450;
    uStack_568 = uStack_448;
    local_5a0 = (Matrix<double,_4,_1,_0,_4,_1> *)local_480.m_lhs;
    IStack_598 = (Index)local_480.m_rhs;
    IStack_590 = IStack_470;
    IStack_588 = IStack_468;
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(local_658);
    local_620 = *(PointerType)(local_658._0_8_ + 0xb8);
    uStack_618 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_658 + 8));
    (*((this->tapered_section).
       super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_ChBeamSectionTaperedTimoshenkoAdvancedGeneric[7])(local_658);
    local_5c0 = *(PointerType)(local_658._0_8_ + 0xc0);
    uStack_5b8 = 0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_658 + 8));
    local_658._0_8_ = &local_5b0;
    local_658._8_8_ = &local_490;
    local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0]
         = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_658);
    local_658._0_8_ = &local_5b0;
    local_658._8_8_ = &local_4a0;
    local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3]
         = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_658);
    local_658._0_8_ = &local_560;
    local_658._16_8_ = local_4e0;
    local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4]
         = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_658);
    local_658._0_8_ = &local_540;
    local_658._8_8_ = local_4c0;
    local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5]
         = Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base *)local_658);
    this_00 = local_608;
    auVar7._8_8_ = 0x7fffffffffffffff;
    auVar7._0_8_ = 0x7fffffffffffffff;
    auVar1._8_8_ = uStack_618;
    auVar1._0_8_ = local_620;
    auVar1 = vandpd_avx(auVar7,auVar1);
    auVar2._8_8_ = uStack_5b8;
    auVar2._0_8_ = local_5c0;
    auVar2 = vandpd_avx(auVar7,auVar2);
    uVar3 = vcmppd_avx512vl(auVar1,ZEXT816(0x3f50624dd2f1a9fc),5);
    uVar4 = vcmppd_avx512vl(auVar2,ZEXT816(0x3f50624dd2f1a9fc),5);
    if ((((byte)uVar3 & 3) & uVar4 & 1) == 0) {
      local_658._0_8_ = &local_580;
      local_658._16_8_ = local_4c0;
      local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)local_658);
      local_658._0_8_ = &local_5a0;
      local_658._16_8_ = local_4e0;
      local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [2] = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)local_658);
    }
    else {
      local_658._0_8_ = &local_500;
      local_658._8_8_ = local_4c0;
      local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [1] = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)local_658);
      local_658._0_8_ = &local_520;
      local_658._8_8_ = local_4e0;
      local_5f0.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
      [2] = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)local_658);
    }
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_658,&local_5f0,0,3);
    ChVector<double>::operator=
              (this_00,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                        *)local_658);
    Eigen::VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1>::VectorBlock
              ((VectorBlock<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1> *)local_658,&local_5f0,3,3);
    ChVector<double>::operator=
              (StrainV_rot,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               local_658);
    Eigen::internal::handmade_aligned_free(local_668[0]);
    Eigen::internal::handmade_aligned_free
              (local_600.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
    return;
  }
  __assert_fail("tapered_section",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementBeamTaperedTimoshenko.cpp"
                ,0x578,
                "virtual void chrono::fea::ChElementBeamTaperedTimoshenko::EvaluateSectionStrain(const double, ChVector<> &, ChVector<> &)"
               );
}

Assistant:

void ChElementBeamTaperedTimoshenko::EvaluateSectionStrain(const double eta,
                                                           ChVector<>& StrainV_trans,
                                                           ChVector<>& StrainV_rot) {
    assert(tapered_section);

    ChVectorDynamic<> displ(this->GetNdofs());
    this->GetStateBlock(displ);

    ChVectorDynamic<> displ_ec = this->T * displ;  // transform the displacement of two nodes to elastic axis

    ChVectorN<double, 4> qey;
    qey << displ_ec(1), displ_ec(5), displ_ec(7), displ_ec(11);
    ChVectorN<double, 4> qez;
    qez << displ_ec(2), displ_ec(4), displ_ec(8), displ_ec(10);
    ChVectorN<double, 2> qeux;
    qeux << displ_ec(0), displ_ec(6);
    ChVectorN<double, 2> qerx;
    qerx << displ_ec(3), displ_ec(9);

    ShapeFunctionGroup NN;
    ShapeFunctionsTimoshenko(NN, eta);
    ShapeFunction5Blocks sfblk1d = std::get<2>(NN);
    ShapeFunction2Blocks sfblk2d = std::get<3>(NN);
    ShapeFunction2Blocks sfblk3d = std::get<4>(NN);
    auto dkNx1 = std::get<4>(sfblk1d);
    auto dkNsy = std::get<1>(sfblk1d);
    auto dkNsz = std::get<3>(sfblk1d);
    auto ddkNby = std::get<0>(sfblk2d);
    auto ddkNbz = std::get<1>(sfblk2d);
    auto dddkNby = std::get<0>(sfblk3d);
    auto dddkNbz = std::get<1>(sfblk3d);

    ////double EA = this->tapered_section->GetAverageSectionParameters()->EA;
    ////double GJ = this->tapered_section->GetAverageSectionParameters()->GJ;
    double GAyy = this->tapered_section->GetAverageSectionParameters()->GAyy;
    double GAzz = this->tapered_section->GetAverageSectionParameters()->GAzz;
    ////double EIyy = this->tapered_section->GetAverageSectionParameters()->EIyy;
    ////double EIzz = this->tapered_section->GetAverageSectionParameters()->EIzz;

    double eps = 1.0e-3;
    bool use_shear_stain = true;  // As default, use shear strain to evaluate the shear forces
    if (abs(GAyy) < eps ||
        abs(GAzz) < eps) {  // Sometimes, the user will not input GAyy, GAzz, so GAyy, GAzz may be zero.
        use_shear_stain = false;
    }

    // generalized strains/curvatures;
    ChVectorN<double, 6> sect_ek;
    sect_ek(0) = dkNx1 * qeux;   // ux
    sect_ek(3) = dkNx1 * qerx;   // rotx
    sect_ek(4) = -ddkNbz * qez;  // roty
    sect_ek(5) = ddkNby * qey;   // rotz

    if (use_shear_stain) {
        // Strictly speaking, dkNsy * qey,dkNsz * qez are the real shear strains.
        sect_ek(1) = dkNsy * qey;  // gamma_y = dkNsy * qey; Fy = GAyy * gamma_y;
        sect_ek(2) = dkNsz * qez;  // gamma_z = dkNsz * qez; Fz = GAzz * gamma_z;
    } else {
        // Calculate the shear strain through third-differentian of bending displacement
        sect_ek(1) = -dddkNby * qey;  // Fy == -EIzz * dddkNby * qey == GAyy * dkNsy * qey;
        sect_ek(2) = -dddkNbz * qez;  // Fz == -EIyy *  dddkNbz * qez == GAzz * dkNsz * qez;
    }

    StrainV_trans = sect_ek.segment(0, 3);
    StrainV_rot = sect_ek.segment(3, 3);
}